

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan.c
# Opt level: O0

VkResult glfwCreateWindowSurface
                   (VkInstance instance,GLFWwindow *handle,VkAllocationCallbacks *allocator,
                   VkSurfaceKHR *surface)

{
  GLFWbool GVar1;
  _GLFWwindow *window;
  VkSurfaceKHR *surface_local;
  VkAllocationCallbacks *allocator_local;
  GLFWwindow *handle_local;
  VkInstance instance_local;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/susonthapa[P]3d-chair/lib/glfw/src/vulkan.c"
                  ,0x118,
                  "VkResult glfwCreateWindowSurface(VkInstance, GLFWwindow *, const VkAllocationCallbacks *, VkSurfaceKHR *)"
                 );
  }
  if (surface != (VkSurfaceKHR *)0x0) {
    *surface = 0;
    if (_glfwInitialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
      instance_local._4_4_ = VK_ERROR_INITIALIZATION_FAILED;
    }
    else {
      GVar1 = _glfwInitVulkan();
      if (GVar1 == 0) {
        _glfwInputError(0x10006,"Vulkan: API not available");
        instance_local._4_4_ = VK_ERROR_INITIALIZATION_FAILED;
      }
      else if (_glfw.vk.extensions == (char **)0x0) {
        _glfwInputError(0x10006,"Vulkan: Window surface creation extensions not found");
        instance_local._4_4_ = VK_ERROR_EXTENSION_NOT_PRESENT;
      }
      else {
        instance_local._4_4_ =
             _glfwPlatformCreateWindowSurface(instance,(_GLFWwindow *)handle,allocator,surface);
      }
    }
    return instance_local._4_4_;
  }
  __assert_fail("surface != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/susonthapa[P]3d-chair/lib/glfw/src/vulkan.c"
                ,0x119,
                "VkResult glfwCreateWindowSurface(VkInstance, GLFWwindow *, const VkAllocationCallbacks *, VkSurfaceKHR *)"
               );
}

Assistant:

GLFWAPI VkResult glfwCreateWindowSurface(VkInstance instance,
                                         GLFWwindow* handle,
                                         const VkAllocationCallbacks* allocator,
                                         VkSurfaceKHR* surface)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);
    assert(surface != NULL);

    *surface = VK_NULL_HANDLE;

    _GLFW_REQUIRE_INIT_OR_RETURN(VK_ERROR_INITIALIZATION_FAILED);

    if (!_glfwInitVulkan())
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "Vulkan: API not available");
        return VK_ERROR_INITIALIZATION_FAILED;
    }

    if (!_glfw.vk.extensions)
    {
        _glfwInputError(GLFW_API_UNAVAILABLE,
                        "Vulkan: Window surface creation extensions not found");
        return VK_ERROR_EXTENSION_NOT_PRESENT;
    }

    return _glfwPlatformCreateWindowSurface(instance, window, allocator, surface);
}